

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

boolean monclass_nogen(char monclass)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0xe;
  uVar1 = 0;
  while (*(char *)((long)crawl + lVar2 + 0x1a) != monclass) {
    uVar1 = uVar1 + 1;
    lVar2 = lVar2 + 0x40;
    if (uVar1 == 0x158) {
      return '\0';
    }
  }
  if (uVar1 == 0x158) {
    return '\0';
  }
  if (uVar1 < 0x158) {
    while( true ) {
      if (*(char *)((long)crawl + lVar2 + 0x1a) != monclass) {
        return '\x01';
      }
      if ((*(byte *)((long)mons[0].mattk + lVar2 + -0xf) & 2) == 0) break;
      lVar2 = lVar2 + 0x40;
      if (lVar2 == 0x560e) {
        return '\x01';
      }
    }
    return '\0';
  }
  return '\x01';
}

Assistant:

boolean monclass_nogen(char monclass)
{
	int first, i;

/*	Assumption #1:	monsters of a given class are contiguous in the
 *			mons[] array.
 */
	for (first = LOW_PM; first < SPECIAL_PM; first++)
	    if (mons[first].mlet == monclass) break;
	if (first == SPECIAL_PM) return FALSE;

	for (i = first; i < SPECIAL_PM && mons[i].mlet == monclass; i++)
	    if (!(mons[i].geno & G_NOGEN)) return FALSE;
	return TRUE;
}